

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APA.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::APA::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,APA *this)

{
  ostream *poVar1;
  KINT32 Value;
  KStringStream ss;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"APA:");
  poVar1 = std::operator<<(poVar1,"\n\tParam Index:  ");
  ENUMS::GetEnumAsStringAdditionalPassiveParameterIndex_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)((this->m_ApaUnion).m_ui16ParamIndex & 0x3fff),Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\n\tStatus:       ( ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_ApaUnion).m_ui16ParamIndex >> 0xf);
  poVar1 = std::operator<<(poVar1," , ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(this->m_ApaUnion).m_ui16ParamIndex >> 0xe & 1);
  poVar1 = std::operator<<(poVar1," )");
  poVar1 = std::operator<<(poVar1,"\n\tValue:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_i16Value);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString APA::GetAsString() const
{
    KStringStream ss;

    ss << "APA:"
       << "\n\tParam Index:  " << GetEnumAsStringAdditionalPassiveParameterIndex( m_ApaUnion.m_ui16APPI )
       << "\n\tStatus:       ( " << m_ApaUnion.m_ui16Status1 << " , " << m_ApaUnion.m_ui16Status2 << " )"
       << "\n\tValue:        " << m_i16Value
       << "\n";

    return ss.str();
}